

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

int __thiscall Fluid::init(Fluid *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  srcs_24;
  int extraout_EAX;
  VAO *pVVar2;
  Program *pPVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ab0;
  allocator<char> local_9fa;
  allocator<char> local_9f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  string local_9d0 [32];
  iterator local_9b0;
  size_type local_9a8;
  undefined1 local_99a;
  allocator<char> local_999 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  iterator local_970;
  size_type local_968;
  undefined1 local_95a;
  allocator<char> local_959 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  iterator local_930;
  size_type local_928;
  undefined1 local_91a;
  allocator<char> local_919 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  iterator local_8f0;
  size_type local_8e8;
  undefined1 local_8db;
  allocator<char> local_8da;
  allocator<char> local_8d9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  string local_8b0 [32];
  iterator local_890;
  size_type local_888;
  undefined1 local_87a;
  allocator<char> local_879 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  iterator local_850;
  size_type local_848;
  undefined1 local_83a;
  allocator<char> local_839 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  iterator local_810;
  size_type local_808;
  undefined1 local_7fa;
  allocator<char> local_7f9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  iterator local_7d0;
  size_type local_7c8;
  undefined1 local_7ba;
  allocator<char> local_7b9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  iterator local_790;
  size_type local_788;
  undefined1 local_77a;
  allocator<char> local_779 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  iterator local_750;
  size_type local_748;
  undefined1 local_73b;
  allocator<char> local_73a;
  allocator<char> local_739 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  string local_710 [32];
  iterator local_6f0;
  size_type local_6e8;
  undefined1 local_6db;
  allocator<char> local_6da;
  allocator<char> local_6d9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  string local_6b0 [32];
  iterator local_690;
  size_type local_688;
  undefined1 local_67b;
  allocator<char> local_67a;
  allocator<char> local_679 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  string local_650 [32];
  iterator local_630;
  size_type local_628;
  undefined1 local_61a;
  allocator<char> local_619 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  iterator local_5f0;
  size_type local_5e8;
  undefined1 local_5dc;
  allocator<char> local_5db;
  allocator<char> local_5da;
  allocator<char> local_5d9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  string local_5b0 [32];
  string local_590 [32];
  iterator local_570;
  size_type local_568;
  undefined1 local_55b;
  allocator<char> local_55a;
  allocator<char> local_559 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  string local_530 [32];
  iterator local_510;
  size_type local_508;
  undefined1 local_4fb;
  allocator<char> local_4fa;
  allocator<char> local_4f9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0 [32];
  iterator local_4b0;
  size_type local_4a8;
  undefined1 local_49b;
  allocator<char> local_49a;
  allocator<char> local_499 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string local_470 [32];
  iterator local_450;
  size_type local_448;
  undefined1 local_43d;
  allocator<char> local_43c;
  allocator<char> local_43b;
  allocator<char> local_43a;
  allocator<char> local_439 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  iterator local_3b0;
  size_type local_3a8;
  undefined1 local_39c;
  allocator<char> local_39b;
  allocator<char> local_39a;
  allocator<char> local_399 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370 [32];
  string local_350 [32];
  iterator local_330;
  size_type local_328;
  undefined1 local_31b;
  allocator<char> local_31a;
  allocator<char> local_319 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0 [32];
  iterator local_2d0;
  size_type local_2c8;
  undefined1 local_2bb;
  allocator<char> local_2ba;
  allocator<char> local_2b9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290 [32];
  iterator local_270;
  size_type local_268;
  undefined1 local_25b;
  allocator<char> local_25a;
  allocator<char> local_259 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230 [32];
  iterator local_210;
  size_type local_208;
  undefined1 local_1fd;
  allocator<char> local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  iterator local_170;
  size_type local_168;
  undefined1 local_15d;
  allocator<char> local_15c;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  iterator local_d0;
  size_type local_c8;
  undefined1 local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  iterator local_70;
  size_type local_68;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_60;
  vec<2,_float,_(glm::qualifier)0> local_38;
  float local_30;
  int local_2c;
  float f;
  int i;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  circle;
  Fluid *this_local;
  
  circle.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  init_ssbos(this);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)&f);
  for (local_2c = 0; local_2c < this->num_circle_vertices; local_2c = local_2c + 1) {
    fVar4 = (float)local_2c;
    iVar1 = this->num_circle_vertices;
    local_30 = glm::pi<float>();
    local_30 = (fVar4 / (float)iVar1) * local_30;
    local_30 = local_30 + local_30;
    dVar5 = std::sin((double)(ulong)(uint)local_30);
    dVar6 = std::cos((double)(ulong)(uint)local_30);
    glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_38,SUB84(dVar5,0),SUB84(dVar6,0));
    std::
    vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
    ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
              ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                *)&f,&local_38);
  }
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_60,
           (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)&f);
  gfx::Buffer::set_data<glm::vec<2,float,(glm::qualifier)0>>(&this->circle_verts,&local_60,0x88e4);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector(&local_60);
  pVVar2 = gfx::VAO::bind_attrib(&this->vao,&this->circle_verts,2,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,&this->particle_ssbo,0x10,0x30,3,0x1406,1);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,&this->particle_ssbo,0x20,0x30,3,0x1406,1);
  gfx::VAO::bind_attrib(pVVar2,&this->particle_ssbo,0,0x30,4,0x1406,1);
  pVVar2 = gfx::VAO::bind_attrib(&this->grid_vao,&this->grid_ssbo,0,0x50,3,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,&this->grid_ssbo,0x10,0x50,3,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,&this->grid_ssbo,0xc,0x50,1,0x1404,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,&this->grid_ssbo,0x1c,0x50,1,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,&this->grid_ssbo,0x2c,0x50,4,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,&this->grid_ssbo,0x40,0x50,1,0x1406,0);
  gfx::VAO::bind_attrib(pVVar2,&this->grid_ssbo,0x44,0x50,1,0x1404,0);
  pVVar2 = gfx::VAO::bind_attrib
                     (&this->debug_lines_vao,&this->debug_lines_ssbo,0x10,0x30,3,0x1406,0);
  pVVar2 = gfx::VAO::bind_attrib(pVVar2,&this->debug_lines_ssbo,0x20,0x30,3,0x1406,0);
  gfx::VAO::bind_attrib(pVVar2,&this->debug_lines_ssbo,0,0x30,4,0x1406,0);
  local_bb = '\x01';
  local_b9._1_8_ = &local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"common.glsl",local_b9);
  local_b9._1_8_ = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"reset_grid.cs.glsl",&local_ba);
  local_bb = '\0';
  local_70 = &local_b0;
  local_68 = 2;
  srcs_24._M_len = 2;
  srcs_24._M_array = local_70;
  pPVar3 = gfx::Program::compute(&this->reset_grid_program,srcs_24);
  gfx::Program::compile(pPVar3);
  local_ab0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70;
  do {
    local_ab0 = local_ab0 + -1;
    std::__cxx11::string::~string((string *)local_ab0);
  } while (local_ab0 != &local_b0);
  std::allocator<char>::~allocator(&local_ba);
  std::allocator<char>::~allocator(local_b9);
  local_15d = '\x01';
  local_159._1_8_ = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"atomic.glsl",local_159);
  local_159._1_8_ = local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"common.glsl",&local_15a);
  local_159._1_8_ = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"p2g_common.glsl",&local_15b);
  local_159._1_8_ = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"p2g_accumulate.cs.glsl",&local_15c);
  local_15d = '\0';
  local_d0 = &local_150;
  local_c8 = 4;
  srcs_23._M_len = 4;
  srcs_23._M_array = local_d0;
  pPVar3 = gfx::Program::compute(&this->p2g_accumulate_program,srcs_23);
  gfx::Program::compile(pPVar3);
  local_b18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0;
  do {
    local_b18 = local_b18 + -1;
    std::__cxx11::string::~string((string *)local_b18);
  } while (local_b18 != &local_150);
  std::allocator<char>::~allocator(&local_15c);
  std::allocator<char>::~allocator(&local_15b);
  std::allocator<char>::~allocator(&local_15a);
  std::allocator<char>::~allocator(local_159);
  local_1fd = '\x01';
  local_1f9._1_8_ = &local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"atomic.glsl",local_1f9);
  local_1f9._1_8_ = local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"common.glsl",&local_1fa);
  local_1f9._1_8_ = local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"p2g_common.glsl",&local_1fb);
  local_1f9._1_8_ = local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"p2g_apply.cs.glsl",&local_1fc);
  local_1fd = '\0';
  local_170 = &local_1f0;
  local_168 = 4;
  srcs_22._M_len = 4;
  srcs_22._M_array = local_170;
  pPVar3 = gfx::Program::compute(&this->p2g_apply_program,srcs_22);
  gfx::Program::compile(pPVar3);
  local_b80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
  do {
    local_b80 = local_b80 + -1;
    std::__cxx11::string::~string((string *)local_b80);
  } while (local_b80 != &local_1f0);
  std::allocator<char>::~allocator(&local_1fc);
  std::allocator<char>::~allocator(&local_1fb);
  std::allocator<char>::~allocator(&local_1fa);
  std::allocator<char>::~allocator(local_1f9);
  local_25b = '\x01';
  local_259._1_8_ = &local_250;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"common.glsl",local_259);
  local_259._1_8_ = local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"grid_to_particle.cs.glsl",&local_25a);
  local_25b = '\0';
  local_210 = &local_250;
  local_208 = 2;
  srcs_21._M_len = 2;
  srcs_21._M_array = local_210;
  pPVar3 = gfx::Program::compute(&this->grid_to_particle_program,srcs_21);
  gfx::Program::compile(pPVar3);
  local_bc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210;
  do {
    local_bc8 = local_bc8 + -1;
    std::__cxx11::string::~string((string *)local_bc8);
  } while (local_bc8 != &local_250);
  std::allocator<char>::~allocator(&local_25a);
  std::allocator<char>::~allocator(local_259);
  local_2bb = '\x01';
  local_2b9._1_8_ = &local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"common.glsl",local_2b9);
  local_2b9._1_8_ = local_290;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_290,"extrapolate.cs.glsl",&local_2ba);
  local_2bb = '\0';
  local_270 = &local_2b0;
  local_268 = 2;
  srcs_20._M_len = 2;
  srcs_20._M_array = local_270;
  pPVar3 = gfx::Program::compute(&this->extrapolate_program,srcs_20);
  gfx::Program::compile(pPVar3);
  local_c10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270;
  do {
    local_c10 = local_c10 + -1;
    std::__cxx11::string::~string((string *)local_c10);
  } while (local_c10 != &local_2b0);
  std::allocator<char>::~allocator(&local_2ba);
  std::allocator<char>::~allocator(local_2b9);
  local_31b = '\x01';
  local_319._1_8_ = &local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"common.glsl",local_319);
  local_319._1_8_ = local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"set_vel_known.cs.glsl",&local_31a);
  local_31b = '\0';
  local_2d0 = &local_310;
  local_2c8 = 2;
  srcs_19._M_len = 2;
  srcs_19._M_array = local_2d0;
  pPVar3 = gfx::Program::compute(&this->set_vel_known_program,srcs_19);
  gfx::Program::compile(pPVar3);
  local_c58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d0;
  do {
    local_c58 = local_c58 + -1;
    std::__cxx11::string::~string((string *)local_c58);
  } while (local_c58 != &local_310);
  std::allocator<char>::~allocator(&local_31a);
  std::allocator<char>::~allocator(local_319);
  local_39c = '\x01';
  local_399._1_8_ = &local_390;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"common.glsl",local_399);
  local_399._1_8_ = local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"enforce_boundary.cs.glsl",&local_39a);
  local_399._1_8_ = local_350;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_350,"body_forces.cs.glsl",&local_39b);
  local_39c = '\0';
  local_330 = &local_390;
  local_328 = 3;
  srcs_18._M_len = 3;
  srcs_18._M_array = local_330;
  pPVar3 = gfx::Program::compute(&this->body_forces_program,srcs_18);
  gfx::Program::compile(pPVar3);
  local_cb0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_330;
  do {
    local_cb0 = local_cb0 + -1;
    std::__cxx11::string::~string((string *)local_cb0);
  } while (local_cb0 != &local_390);
  std::allocator<char>::~allocator(&local_39b);
  std::allocator<char>::~allocator(&local_39a);
  std::allocator<char>::~allocator(local_399);
  local_43d = '\x01';
  local_439._1_8_ = &local_430;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"common.glsl",local_439);
  local_439._1_8_ = local_410;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_410,"setup_project.cs.glsl",&local_43a);
  local_439._1_8_ = local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f0,"compute_divergence.cs.glsl",&local_43b);
  local_439._1_8_ = local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3d0,"build_a.cs.glsl",&local_43c);
  local_43d = '\0';
  local_3b0 = &local_430;
  local_3a8 = 4;
  srcs_17._M_len = 4;
  srcs_17._M_array = local_3b0;
  pPVar3 = gfx::Program::compute(&this->setup_grid_project_program,srcs_17);
  gfx::Program::compile(pPVar3);
  local_d18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0;
  do {
    local_d18 = local_d18 + -1;
    std::__cxx11::string::~string((string *)local_d18);
  } while (local_d18 != &local_430);
  std::allocator<char>::~allocator(&local_43c);
  std::allocator<char>::~allocator(&local_43b);
  std::allocator<char>::~allocator(&local_43a);
  std::allocator<char>::~allocator(local_439);
  local_49b = '\x01';
  local_499._1_8_ = &local_490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"common.glsl",local_499);
  local_499._1_8_ = local_470;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_470,"jacobi_iterate.cs.glsl",&local_49a);
  local_49b = '\0';
  local_450 = &local_490;
  local_448 = 2;
  srcs_16._M_len = 2;
  srcs_16._M_array = local_450;
  pPVar3 = gfx::Program::compute(&this->jacobi_iterate_program,srcs_16);
  gfx::Program::compile(pPVar3);
  local_d60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_450;
  do {
    local_d60 = local_d60 + -1;
    std::__cxx11::string::~string((string *)local_d60);
  } while (local_d60 != &local_490);
  std::allocator<char>::~allocator(&local_49a);
  std::allocator<char>::~allocator(local_499);
  local_4fb = '\x01';
  local_4f9._1_8_ = &local_4f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"common.glsl",local_4f9);
  local_4f9._1_8_ = local_4d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d0,"pressure_to_guess.cs.glsl",&local_4fa);
  local_4fb = '\0';
  local_4b0 = &local_4f0;
  local_4a8 = 2;
  srcs_15._M_len = 2;
  srcs_15._M_array = local_4b0;
  pPVar3 = gfx::Program::compute(&this->pressure_to_guess_program,srcs_15);
  gfx::Program::compile(pPVar3);
  local_da8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b0;
  do {
    local_da8 = local_da8 + -1;
    std::__cxx11::string::~string((string *)local_da8);
  } while (local_da8 != &local_4f0);
  std::allocator<char>::~allocator(&local_4fa);
  std::allocator<char>::~allocator(local_4f9);
  local_55b = '\x01';
  local_559._1_8_ = &local_550;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"common.glsl",local_559);
  local_559._1_8_ = local_530;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_530,"pressure_update.cs.glsl",&local_55a)
  ;
  local_55b = '\0';
  local_510 = &local_550;
  local_508 = 2;
  srcs_14._M_len = 2;
  srcs_14._M_array = local_510;
  pPVar3 = gfx::Program::compute(&this->pressure_update_program,srcs_14);
  gfx::Program::compile(pPVar3);
  local_df0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_510;
  do {
    local_df0 = local_df0 + -1;
    std::__cxx11::string::~string((string *)local_df0);
  } while (local_df0 != &local_550);
  std::allocator<char>::~allocator(&local_55a);
  std::allocator<char>::~allocator(local_559);
  local_5dc = '\x01';
  local_5d9._1_8_ = &local_5d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"common.glsl",local_5d9);
  local_5d9._1_8_ = local_5b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5b0,"rand.glsl",&local_5da);
  local_5d9._1_8_ = local_590;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_590,"particle_advect.cs.glsl",&local_5db)
  ;
  local_5dc = '\0';
  local_570 = &local_5d0;
  local_568 = 3;
  srcs_13._M_len = 3;
  srcs_13._M_array = local_570;
  pPVar3 = gfx::Program::compute(&this->particle_advect_program,srcs_13);
  gfx::Program::compile(pPVar3);
  local_e48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_570;
  do {
    local_e48 = local_e48 + -1;
    std::__cxx11::string::~string((string *)local_e48);
  } while (local_e48 != &local_5d0);
  std::allocator<char>::~allocator(&local_5db);
  std::allocator<char>::~allocator(&local_5da);
  std::allocator<char>::~allocator(local_5d9);
  local_61a = '\x01';
  local_619._1_8_ = &local_610;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"particles.vs.glsl",local_619);
  local_61a = '\0';
  local_5f0 = &local_610;
  local_5e8 = 1;
  srcs_12._M_len = 1;
  srcs_12._M_array = local_5f0;
  pPVar3 = gfx::Program::vertex(&this->program,srcs_12);
  local_67b = '\x01';
  local_679._1_8_ = &local_670;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"lighting.glsl",local_679)
  ;
  local_679._1_8_ = local_650;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_650,"particles.fs.glsl",&local_67a);
  local_67b = '\0';
  local_630 = &local_670;
  local_628 = 2;
  srcs_11._M_len = 2;
  srcs_11._M_array = local_630;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_11);
  gfx::Program::compile(pPVar3);
  local_ea8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_630;
  do {
    local_ea8 = local_ea8 + -1;
    std::__cxx11::string::~string((string *)local_ea8);
  } while (local_ea8 != &local_670);
  std::allocator<char>::~allocator(&local_67a);
  std::allocator<char>::~allocator(local_679);
  local_ec0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5f0;
  do {
    local_ec0 = local_ec0 + -1;
    std::__cxx11::string::~string((string *)local_ec0);
  } while (local_ec0 != &local_610);
  std::allocator<char>::~allocator(local_619);
  local_6db = '\x01';
  local_6d9._1_8_ = &local_6d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"common.glsl",local_6d9);
  local_6d9._1_8_ = local_6b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b0,"grid.vs.glsl",&local_6da);
  local_6db = '\0';
  local_690 = &local_6d0;
  local_688 = 2;
  srcs_10._M_len = 2;
  srcs_10._M_array = local_690;
  pPVar3 = gfx::Program::vertex(&this->grid_program,srcs_10);
  local_73b = '\x01';
  local_739._1_8_ = &local_730;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"common.glsl",local_739);
  local_739._1_8_ = local_710;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_710,"grid.gs.glsl",&local_73a);
  local_73b = '\0';
  local_6f0 = &local_730;
  local_6e8 = 2;
  srcs_09._M_len = 2;
  srcs_09._M_array = local_6f0;
  pPVar3 = gfx::Program::geometry(pPVar3,srcs_09);
  local_77a = '\x01';
  local_779._1_8_ = &local_770;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"grid.fs.glsl",local_779);
  local_77a = '\0';
  local_750 = &local_770;
  local_748 = 1;
  srcs_08._M_len = 1;
  srcs_08._M_array = local_750;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_08);
  gfx::Program::compile(pPVar3);
  local_f48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_750;
  do {
    local_f48 = local_f48 + -1;
    std::__cxx11::string::~string((string *)local_f48);
  } while (local_f48 != &local_770);
  std::allocator<char>::~allocator(local_779);
  local_f60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6f0;
  do {
    local_f60 = local_f60 + -1;
    std::__cxx11::string::~string((string *)local_f60);
  } while (local_f60 != &local_730);
  std::allocator<char>::~allocator(&local_73a);
  std::allocator<char>::~allocator(local_739);
  local_f78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_690;
  do {
    local_f78 = local_f78 + -1;
    std::__cxx11::string::~string((string *)local_f78);
  } while (local_f78 != &local_6d0);
  std::allocator<char>::~allocator(&local_6da);
  std::allocator<char>::~allocator(local_6d9);
  local_7ba = '\x01';
  local_7b9._1_8_ = &local_7b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"debug_lines.vs.glsl",local_7b9);
  local_7ba = '\0';
  local_790 = &local_7b0;
  local_788 = 1;
  srcs_07._M_len = 1;
  srcs_07._M_array = local_790;
  pPVar3 = gfx::Program::vertex(&this->debug_lines_program,srcs_07);
  local_7fa = '\x01';
  local_7f9._1_8_ = &local_7f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"debug_lines.gs.glsl",local_7f9);
  local_7fa = '\0';
  local_7d0 = &local_7f0;
  local_7c8 = 1;
  srcs_06._M_len = 1;
  srcs_06._M_array = local_7d0;
  pPVar3 = gfx::Program::geometry(pPVar3,srcs_06);
  local_83a = '\x01';
  local_839._1_8_ = &local_830;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,"debug_lines.fs.glsl",local_839);
  local_83a = '\0';
  local_810 = &local_830;
  local_808 = 1;
  srcs_05._M_len = 1;
  srcs_05._M_array = local_810;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_05);
  gfx::Program::compile(pPVar3);
  local_fe0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_810;
  do {
    local_fe0 = local_fe0 + -1;
    std::__cxx11::string::~string((string *)local_fe0);
  } while (local_fe0 != &local_830);
  std::allocator<char>::~allocator(local_839);
  local_ff8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7d0;
  do {
    local_ff8 = local_ff8 + -1;
    std::__cxx11::string::~string((string *)local_ff8);
  } while (local_ff8 != &local_7f0);
  std::allocator<char>::~allocator(local_7f9);
  local_1010 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_790;
  do {
    local_1010 = local_1010 + -1;
    std::__cxx11::string::~string((string *)local_1010);
  } while (local_1010 != &local_7b0);
  std::allocator<char>::~allocator(local_7b9);
  local_87a = '\x01';
  local_879._1_8_ = &local_870;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_870,"particles.vs.glsl",local_879);
  local_87a = '\0';
  local_850 = &local_870;
  local_848 = 1;
  srcs_04._M_len = 1;
  srcs_04._M_array = local_850;
  pPVar3 = gfx::Program::vertex(&this->ssf_spheres_program,srcs_04);
  local_8db = '\x01';
  local_8d9._1_8_ = &local_8d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"common.glsl",local_8d9);
  local_8d9._1_8_ = local_8b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8b0,"ssf_spheres.fs.glsl",&local_8da);
  local_8db = '\0';
  local_890 = &local_8d0;
  local_888 = 2;
  srcs_03._M_len = 2;
  srcs_03._M_array = local_890;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_03);
  gfx::Program::compile(pPVar3);
  local_1070 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_890;
  do {
    local_1070 = local_1070 + -1;
    std::__cxx11::string::~string((string *)local_1070);
  } while (local_1070 != &local_8d0);
  std::allocator<char>::~allocator(&local_8da);
  std::allocator<char>::~allocator(local_8d9);
  local_1088 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_850;
  do {
    local_1088 = local_1088 + -1;
    std::__cxx11::string::~string((string *)local_1088);
  } while (local_1088 != &local_870);
  std::allocator<char>::~allocator(local_879);
  local_91a = '\x01';
  local_919._1_8_ = &local_910;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_910,"screen_quad.vs.glsl",local_919);
  local_91a = '\0';
  local_8f0 = &local_910;
  local_8e8 = 1;
  srcs_02._M_len = 1;
  srcs_02._M_array = local_8f0;
  pPVar3 = gfx::Program::vertex(&this->ssf_smooth_program,srcs_02);
  local_95a = '\x01';
  local_959._1_8_ = &local_950;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"ssf_smooth.fs.glsl",local_959);
  local_95a = '\0';
  local_930 = &local_950;
  local_928 = 1;
  srcs_01._M_len = 1;
  srcs_01._M_array = local_930;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs_01);
  gfx::Program::compile(pPVar3);
  local_10d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_930;
  do {
    local_10d8 = local_10d8 + -1;
    std::__cxx11::string::~string((string *)local_10d8);
  } while (local_10d8 != &local_950);
  std::allocator<char>::~allocator(local_959);
  local_10f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8f0;
  do {
    local_10f0 = local_10f0 + -1;
    std::__cxx11::string::~string((string *)local_10f0);
  } while (local_10f0 != &local_910);
  std::allocator<char>::~allocator(local_919);
  local_99a = '\x01';
  local_999._1_8_ = &local_990;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,"screen_quad.vs.glsl",local_999);
  local_99a = '\0';
  local_970 = &local_990;
  local_968 = 1;
  srcs_00._M_len = 1;
  srcs_00._M_array = local_970;
  pPVar3 = gfx::Program::vertex(&this->ssf_shade_program,srcs_00);
  local_9f8 = &local_9f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"lighting.glsl",&local_9f9);
  local_9f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9d0,"ssf_shade.fs.glsl",&local_9fa);
  local_9b0 = &local_9f0;
  local_9a8 = 2;
  srcs._M_len = 2;
  srcs._M_array = local_9b0;
  pPVar3 = gfx::Program::fragment(pPVar3,srcs);
  gfx::Program::compile(pPVar3);
  local_1150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_9b0;
  do {
    local_1150 = local_1150 + -1;
    std::__cxx11::string::~string((string *)local_1150);
  } while (local_1150 != &local_9f0);
  std::allocator<char>::~allocator(&local_9fa);
  std::allocator<char>::~allocator(&local_9f9);
  local_1168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_970;
  do {
    local_1168 = local_1168 + -1;
    std::__cxx11::string::~string((string *)local_1168);
  } while (local_1168 != &local_990);
  std::allocator<char>::~allocator(local_999);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)&f);
  return extraout_EAX;
}

Assistant:

void init() {
        init_ssbos();

        // graphics initialization
        // circle vertices (for triangle fan)
        std::vector<glm::vec2> circle;
        for (int i = 0; i < num_circle_vertices; ++i) {
            const float f = static_cast<float>(i) / num_circle_vertices * glm::pi<float>() * 2.0;
            circle.emplace_back(glm::vec2(glm::sin(f), glm::cos(f)));
        }
        circle_verts.set_data(circle);

        vao.bind_attrib(circle_verts, 2, GL_FLOAT)
           .bind_attrib(particle_ssbo, offsetof(Particle, pos), sizeof(Particle), 3, GL_FLOAT, gfx::INSTANCED)
           .bind_attrib(particle_ssbo, offsetof(Particle, vel), sizeof(Particle), 3, GL_FLOAT, gfx::INSTANCED)
           .bind_attrib(particle_ssbo, offsetof(Particle, color), sizeof(Particle), 4, GL_FLOAT, gfx::INSTANCED);
        
        grid_vao.bind_attrib(grid_ssbo, offsetof(GridCell, pos), sizeof(GridCell), 3, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, vel), sizeof(GridCell), 3, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, type), sizeof(GridCell), 1, GL_INT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, rhs), sizeof(GridCell), 1, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, a_diag), sizeof(GridCell), 4, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, pressure), sizeof(GridCell), 1, GL_FLOAT, gfx::NOT_INSTANCED)
           .bind_attrib(grid_ssbo, offsetof(GridCell, vel_unknown), sizeof(GridCell), 1, GL_INT, gfx::NOT_INSTANCED);

        debug_lines_vao.bind_attrib(debug_lines_ssbo, offsetof(DebugLine, a), sizeof(DebugLine), 3, GL_FLOAT, gfx::NOT_INSTANCED)
            .bind_attrib(debug_lines_ssbo, offsetof(DebugLine, b), sizeof(DebugLine), 3, GL_FLOAT, gfx::NOT_INSTANCED)
            .bind_attrib(debug_lines_ssbo, offsetof(DebugLine, color), sizeof(DebugLine), 4, GL_FLOAT, gfx::NOT_INSTANCED);
        
        
        reset_grid_program.compute({"common.glsl", "reset_grid.cs.glsl"}).compile();
        p2g_accumulate_program.compute({"atomic.glsl", "common.glsl", "p2g_common.glsl", "p2g_accumulate.cs.glsl"}).compile();
        p2g_apply_program.compute({"atomic.glsl", "common.glsl", "p2g_common.glsl", "p2g_apply.cs.glsl"}).compile();
        grid_to_particle_program.compute({"common.glsl", "grid_to_particle.cs.glsl"}).compile();
        extrapolate_program.compute({"common.glsl", "extrapolate.cs.glsl"}).compile();
        set_vel_known_program.compute({"common.glsl", "set_vel_known.cs.glsl"}).compile();
        body_forces_program.compute({"common.glsl", "enforce_boundary.cs.glsl", "body_forces.cs.glsl"}).compile();
        setup_grid_project_program.compute({"common.glsl", "setup_project.cs.glsl", "compute_divergence.cs.glsl", "build_a.cs.glsl"}).compile();
        jacobi_iterate_program.compute({"common.glsl", "jacobi_iterate.cs.glsl"}).compile();
        pressure_to_guess_program.compute({"common.glsl", "pressure_to_guess.cs.glsl"}).compile();
        pressure_update_program.compute({"common.glsl", "pressure_update.cs.glsl"}).compile();
        particle_advect_program.compute({"common.glsl", "rand.glsl", "particle_advect.cs.glsl"}).compile();
        
        program.vertex({"particles.vs.glsl"}).fragment({"lighting.glsl", "particles.fs.glsl"}).compile();
        grid_program.vertex({"common.glsl", "grid.vs.glsl"}).geometry({"common.glsl", "grid.gs.glsl"}).fragment({"grid.fs.glsl"}).compile();
        debug_lines_program.vertex({"debug_lines.vs.glsl"}).geometry({"debug_lines.gs.glsl"}).fragment({"debug_lines.fs.glsl"}).compile();

        ssf_spheres_program.vertex({"particles.vs.glsl"}).fragment({"common.glsl", "ssf_spheres.fs.glsl"}).compile();
        ssf_smooth_program.vertex({"screen_quad.vs.glsl"}).fragment({"ssf_smooth.fs.glsl"}).compile();
        ssf_shade_program.vertex({"screen_quad.vs.glsl"}).fragment({"lighting.glsl", "ssf_shade.fs.glsl"}).compile();
    }